

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlTruncate(sqlite3_file *pJfd,sqlite_int64 size)

{
  long in_RSI;
  long in_RDI;
  i64 iOff;
  FileChunk *pIter;
  MemJournal *p;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  long local_28;
  undefined8 *local_20;
  
  if (in_RSI < *(long *)(in_RDI + 0x18)) {
    local_20 = (undefined8 *)0x0;
    if (in_RSI == 0) {
      memjrnlFreeChunks((FileChunk *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      *(undefined8 *)(in_RDI + 0x10) = 0;
    }
    else {
      local_28 = (long)*(int *)(in_RDI + 8);
      for (local_20 = *(undefined8 **)(in_RDI + 0x10);
          local_20 != (undefined8 *)0x0 && local_28 < in_RSI; local_20 = (undefined8 *)*local_20) {
        local_28 = *(int *)(in_RDI + 8) + local_28;
      }
      if (local_20 != (undefined8 *)0x0) {
        memjrnlFreeChunks((FileChunk *)
                          CONCAT17(local_20 != (undefined8 *)0x0 && local_28 < in_RSI,
                                   in_stack_ffffffffffffffd0));
        *local_20 = 0;
      }
    }
    *(undefined8 **)(in_RDI + 0x20) = local_20;
    *(long *)(in_RDI + 0x18) = in_RSI;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  return 0;
}

Assistant:

static int memjrnlTruncate(sqlite3_file *pJfd, sqlite_int64 size){
  MemJournal *p = (MemJournal *)pJfd;
  assert( p->endpoint.pChunk==0 || p->endpoint.pChunk->pNext==0 );
  if( size<p->endpoint.iOffset ){
    FileChunk *pIter = 0;
    if( size==0 ){
      memjrnlFreeChunks(p->pFirst);
      p->pFirst = 0;
    }else{
      i64 iOff = p->nChunkSize;
      for(pIter=p->pFirst; ALWAYS(pIter) && iOff<size; pIter=pIter->pNext){
        iOff += p->nChunkSize;
      }
      if( ALWAYS(pIter) ){
        memjrnlFreeChunks(pIter->pNext);
        pIter->pNext = 0;
      }
    }

    p->endpoint.pChunk = pIter;
    p->endpoint.iOffset = size;
    p->readpoint.pChunk = 0;
    p->readpoint.iOffset = 0;
  }
  return SQLITE_OK;
}